

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O0

void __thiscall Shader::Shader(Shader *this,GLchar *vertexPath,GLchar *fragmentPath)

{
  byte bVar1;
  bool bVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  ostream *poVar6;
  istream *piVar7;
  GLchar *pGStack_730;
  GLuint fragmentShader;
  GLchar *FragmentSourcePointer;
  allocator local_701;
  string local_700 [8];
  string Line_1;
  istream local_6e0 [8];
  ifstream FragmentShaderStream;
  string local_4d8 [8];
  string FragmentShaderCode;
  GLchar *pGStack_4b0;
  GLuint vertexShader;
  GLchar *VertexSourcePointer;
  allocator local_481;
  string local_480 [8];
  string Line;
  istream local_450 [8];
  ifstream VertexShaderStream;
  string local_248 [8];
  string VertexShaderCode;
  GLchar local_228 [8];
  GLchar infoLog [512];
  GLint success;
  GLchar *fragmentPath_local;
  GLchar *vertexPath_local;
  Shader *this_local;
  
  std::__cxx11::string::string(local_248);
  std::ifstream::ifstream(local_450,vertexPath,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_480,"",&local_481);
    std::allocator<char>::~allocator((allocator<char> *)&local_481);
    while( true ) {
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_450,local_480);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
      if (!bVar2) break;
      std::operator+((char *)&VertexSourcePointer,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1b2719);
      std::__cxx11::string::operator+=(local_248,(string *)&VertexSourcePointer);
      std::__cxx11::string::~string((string *)&VertexSourcePointer);
    }
    std::ifstream::close();
    std::__cxx11::string::~string(local_480);
  }
  pGStack_4b0 = (GLchar *)std::__cxx11::string::c_str();
  GVar3 = (*__glewCreateShader)(0x8b31);
  (*__glewShaderSource)(GVar3,1,&stack0xfffffffffffffb50,(GLint *)0x0);
  (*__glewCompileShader)(GVar3);
  (*__glewGetShaderiv)(GVar3,0x8b81,(GLint *)(infoLog + 0x1fc));
  if (infoLog._508_4_ == 0) {
    (*__glewGetShaderInfoLog)(GVar3,0x200,(GLsizei *)0x0,local_228);
    poVar6 = std::operator<<((ostream *)&std::cout,"ERROR::SHADER::VERTEX::COMPILATION_FAILED\n");
    poVar6 = std::operator<<(poVar6,local_228);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"loaded: \'vertexShader\'");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::string(local_4d8);
  std::ifstream::ifstream(local_6e0,fragmentPath,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_700,"",&local_701);
    std::allocator<char>::~allocator((allocator<char> *)&local_701);
    while( true ) {
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_6e0,local_700);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
      if (!bVar2) break;
      std::operator+((char *)&FragmentSourcePointer,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1b2719);
      std::__cxx11::string::operator+=(local_4d8,(string *)&FragmentSourcePointer);
      std::__cxx11::string::~string((string *)&FragmentSourcePointer);
    }
    std::ifstream::close();
    std::__cxx11::string::~string(local_700);
  }
  pGStack_730 = (GLchar *)std::__cxx11::string::c_str();
  GVar4 = (*__glewCreateShader)(0x8b30);
  (*__glewShaderSource)(GVar4,1,&stack0xfffffffffffff8d0,(GLint *)0x0);
  (*__glewCompileShader)(GVar4);
  (*__glewGetShaderiv)(GVar4,0x8b81,(GLint *)(infoLog + 0x1fc));
  if (infoLog._508_4_ == 0) {
    (*__glewGetShaderInfoLog)(GVar4,0x200,(GLsizei *)0x0,local_228);
    poVar6 = std::operator<<((ostream *)&std::cout,"ERROR::SHADER::FRAGMENT::COMPILATION_FAILED\n");
    poVar6 = std::operator<<(poVar6,local_228);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"loaded: \'fragmentShader\'");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  GVar5 = (*__glewCreateProgram)();
  this->Program = GVar5;
  (*__glewAttachShader)(this->Program,GVar3);
  (*__glewAttachShader)(this->Program,GVar4);
  (*__glewLinkProgram)(this->Program);
  (*__glewGetProgramiv)(this->Program,0x8b82,(GLint *)(infoLog + 0x1fc));
  if (infoLog._508_4_ == 0) {
    (*__glewGetProgramInfoLog)(this->Program,0x200,(GLsizei *)0x0,local_228);
    poVar6 = std::operator<<((ostream *)&std::cout,"ERROR::SHADER::PROGRAM::COMPILATION_FAILED [");
    poVar6 = std::operator<<(poVar6,local_228);
    poVar6 = std::operator<<(poVar6,"]");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"loaded: \'shaderProgram\'");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  (*__glewDeleteShader)(GVar3);
  (*__glewDeleteShader)(GVar4);
  std::ifstream::~ifstream(local_6e0);
  std::__cxx11::string::~string(local_4d8);
  std::ifstream::~ifstream(local_450);
  std::__cxx11::string::~string(local_248);
  return;
}

Assistant:

Shader::Shader(const GLchar* vertexPath, const GLchar* fragmentPath) {
	// error info
	GLint success;
	GLchar infoLog[512];

	// get vertex shader code
	std::string VertexShaderCode;
	std::ifstream VertexShaderStream(vertexPath, std::ios::in);
	if (VertexShaderStream.is_open()) {
		std::string Line = "";
		while (getline(VertexShaderStream, Line)) {
			VertexShaderCode += "\n" + Line;
		}
		VertexShaderStream.close();
	}
	const GLchar* VertexSourcePointer = VertexShaderCode.c_str();

	// set vertexshader
	GLuint vertexShader;
	vertexShader = glCreateShader(GL_VERTEX_SHADER);

	glShaderSource(vertexShader, 1, &VertexSourcePointer, NULL);
	glCompileShader(vertexShader);

	glGetShaderiv(vertexShader, GL_COMPILE_STATUS, &success);

	if (!success) {
		glGetShaderInfoLog(vertexShader, 512, NULL, infoLog);
		std::cout << "ERROR::SHADER::VERTEX::COMPILATION_FAILED\n" << infoLog << std::endl;
	}
	else {
		std::cout << "loaded: 'vertexShader'" << std::endl;
	}

	// get fragment shader code
	std::string FragmentShaderCode;
	std::ifstream FragmentShaderStream(fragmentPath, std::ios::in);
	if (FragmentShaderStream.is_open()) {
		std::string Line = "";
		while (getline(FragmentShaderStream, Line)) {
			FragmentShaderCode += "\n" + Line;
		}
		FragmentShaderStream.close();
	}
	const GLchar* FragmentSourcePointer = FragmentShaderCode.c_str();

	// set fragmentshader
	GLuint fragmentShader;
	fragmentShader = glCreateShader(GL_FRAGMENT_SHADER);

	glShaderSource(fragmentShader, 1, &FragmentSourcePointer, NULL);
	glCompileShader(fragmentShader);

	glGetShaderiv(fragmentShader, GL_COMPILE_STATUS, &success);
	if (!success) {
		glGetShaderInfoLog(fragmentShader, 512, NULL, infoLog);
		std::cout << "ERROR::SHADER::FRAGMENT::COMPILATION_FAILED\n" << infoLog << std::endl;
	}
	else {
		std::cout << "loaded: 'fragmentShader'" << std::endl;
	}

	// set shader program
	this->Program = glCreateProgram();

	glAttachShader(this->Program, vertexShader);
	glAttachShader(this->Program, fragmentShader);
	glLinkProgram(this->Program);

	// load program
	glGetProgramiv(this->Program, GL_LINK_STATUS, &success);
	if (!success) {
		glGetProgramInfoLog(this->Program, 512, NULL, infoLog);
		std::cout << "ERROR::SHADER::PROGRAM::COMPILATION_FAILED [" << infoLog << "]" << std::endl;
	}
	else {
		std::cout << "loaded: 'shaderProgram'" << std::endl;
	}

	// delete shaders
	glDeleteShader(vertexShader);
	glDeleteShader(fragmentShader);
}